

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_pos_bucket_dec(llm_graph_context *this)

{
  pointer plVar1;
  ggml_tensor *pgVar2;
  pointer __u;
  llama_kv_cache_unified **in_RDI;
  ggml_tensor **cur;
  uint32_t n_kv;
  __single_object inp;
  llama_kv_cache_unified *kv_self;
  llm_graph_input_ptr *in_stack_ffffffffffffff88;
  llm_graph_result *in_stack_ffffffffffffff90;
  llama_hparams *in_stack_ffffffffffffffb8;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_40 [3];
  ggml_tensor **local_28;
  uint32_t local_1c;
  llama_kv_cache_unified *local_10;
  
  local_10 = in_RDI[0x1d];
  std::
  make_unique<llm_graph_input_pos_bucket_kv,llama_hparams_const&,llama_kv_cache_unified_const*&>
            (in_stack_ffffffffffffffb8,in_RDI);
  local_1c = local_10->n;
  plVar1 = std::
           unique_ptr<llm_graph_input_pos_bucket_kv,_std::default_delete<llm_graph_input_pos_bucket_kv>_>
           ::operator->((unique_ptr<llm_graph_input_pos_bucket_kv,_std::default_delete<llm_graph_input_pos_bucket_kv>_>
                         *)0x43532d);
  local_28 = &plVar1->pos_bucket;
  pgVar2 = (ggml_tensor *)
           ggml_new_tensor_2d(in_RDI[0x18],0x1a,local_1c,(long)*(int *)(in_RDI + 0x15));
  *local_28 = pgVar2;
  ggml_set_input(*local_28);
  __u = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                  ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)0x435390)
  ;
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_pos_bucket_kv,std::default_delete<llm_graph_input_pos_bucket_kv>,void>
            (local_40,(unique_ptr<llm_graph_input_pos_bucket_kv,_std::default_delete<llm_graph_input_pos_bucket_kv>_>
                       *)__u);
  llm_graph_result::add_input(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_ffffffffffffff90);
  pgVar2 = *local_28;
  std::
  unique_ptr<llm_graph_input_pos_bucket_kv,_std::default_delete<llm_graph_input_pos_bucket_kv>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_pos_bucket_kv,_std::default_delete<llm_graph_input_pos_bucket_kv>_>
               *)pgVar2);
  return pgVar2;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos_bucket_dec() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_pos_bucket_kv>(hparams, kv_self);

    const auto n_kv = kv_self->n;

    auto & cur = inp->pos_bucket;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_I32, n_kv, n_tokens);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}